

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

void __thiscall
FFT::FFTExecutor::directTransform(FFTExecutor *this,ComplexData *in,ComplexData *out)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  bool bVar6;
  imageException *this_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (this->_planDirect != (kiss_fftnd_cfg)0x0) {
    bVar6 = equalSize<FFT::FFTExecutor,FFT::ComplexData>(this,in);
    if ((bVar6) &&
       (uVar1 = (in->super_BaseComplexData<kiss_fft_cpx>)._width,
       uVar3 = (in->super_BaseComplexData<kiss_fft_cpx>)._height, auVar7._4_4_ = uVar3,
       auVar7._0_4_ = uVar1, uVar2 = (out->super_BaseComplexData<kiss_fft_cpx>)._width,
       uVar4 = (out->super_BaseComplexData<kiss_fft_cpx>)._height, auVar8._4_4_ = uVar4,
       auVar8._0_4_ = uVar2, auVar7._8_8_ = 0, auVar8._8_8_ = 0,
       uVar5 = vpcmpd_avx512vl(auVar7,auVar8,4), (uVar5 & 3) == 0)) {
      kiss_fftnd(this->_planDirect,(in->super_BaseComplexData<kiss_fft_cpx>)._data,
                 (out->super_BaseComplexData<kiss_fft_cpx>)._data);
      return;
    }
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Invalid parameters for FFTExecutor::directTransform()");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FFTExecutor::directTransform( const ComplexData & in, ComplexData & out )
    {
        if ( _planDirect == 0 || !equalSize( *this, in ) || !equalSize( in, out ) )
            throw imageException( "Invalid parameters for FFTExecutor::directTransform()" );

        kiss_fftnd( _planDirect, in.data(), out.data() );
    }